

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

FSerializer * Serialize(FSerializer *arc,char *key,double *value,double *defval)

{
  uint uVar1;
  FWriter *pFVar2;
  Value *this;
  double dVar3;
  
  pFVar2 = arc->w;
  if (pFVar2 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      if ((*(byte *)((long)&this->data_ + 0x17) & 2) == 0) {
        __assert_fail("val->IsDouble()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x578,
                      "FSerializer &Serialize(FSerializer &, const char *, double &, double *)");
      }
      dVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetDouble(this);
      *value = dVar3;
    }
  }
  else {
    uVar1 = (pFVar2->mInObject).Count;
    if (((uVar1 != 0) && (defval != (double *)0x0)) &&
       ((pFVar2->mInObject).Array[uVar1 - 1] != false)) {
      if ((*value == *defval) && (!NAN(*value) && !NAN(*defval))) {
        return arc;
      }
    }
    FSerializer::WriteKey(arc,key);
    FWriter::Double(arc->w,*value);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, double &value, double *defval)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || defval == nullptr || value != *defval)
		{
			arc.WriteKey(key);
			arc.w->Double(value);
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsDouble());
			if (val->IsDouble())
			{
				value = val->GetDouble();
			}
			else
			{
				Printf(TEXTCOLOR_RED "float type expected for '%s'", key);
				arc.mErrors++;
			}
		}
	}
	return arc;
}